

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O1

void merge_2way_unstable(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **result)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uchar *__s1;
  uchar *__s2;
  long lVar5;
  uchar **local_40;
  uchar **local_38;
  
  __s1 = *from0;
  __s2 = *from1;
  local_40 = from0;
  local_38 = from1;
  do {
    if (__s1 == (uchar *)0x0) {
LAB_001bf3da:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                    ,0x36,"int cmp(const unsigned char *, const unsigned char *)");
    }
    if (__s2 == (uchar *)0x0) {
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                    ,0x37,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar3 = strcmp((char *)__s1,(char *)__s2);
    if (0 < iVar3) goto LAB_001bf220;
    if (iVar3 != 0) {
      while( true ) {
        lVar5 = 0;
        do {
          iVar3 = strcmp((char *)__s1,(char *)__s2);
          if (-1 < iVar3) {
            __assert_fail("cmp(key0, key1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                          ,0x52,
                          "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          *(uchar **)((long)result + lVar5) = __s1;
          if (n0 == 1) {
            result = (uchar **)((long)result + lVar5 + 8);
            local_40 = (uchar **)((long)local_40 + lVar5);
            goto LAB_001bf37a;
          }
          __s1 = *(uchar **)((long)local_40 + lVar5 + 8);
          if (__s1 == (uchar *)0x0) goto LAB_001bf3da;
          iVar4 = strcmp((char *)__s1,(char *)__s2);
          iVar3 = (uint)(iVar4 == 0) << 2;
          if (iVar4 < 0) {
            iVar3 = 5;
          }
          lVar5 = lVar5 + 8;
          n0 = n0 - 1;
        } while (iVar3 == 5);
        result = (uchar **)((long)result + lVar5);
        if (iVar3 == 4) {
          local_40 = (uchar **)((long)local_40 + lVar5);
          goto LAB_001bf32f;
        }
        if (iVar3 == 1) {
          local_40 = (uchar **)((long)local_40 + lVar5);
          goto LAB_001bf3b5;
        }
        local_40 = (uchar **)((long)local_40 + lVar5);
LAB_001bf220:
        lVar5 = 0;
        do {
          iVar3 = strcmp((char *)__s2,(char *)__s1);
          if (-1 < iVar3) {
            __assert_fail("cmp(key1, key0) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                          ,0x5f,
                          "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                         );
          }
          *(uchar **)((long)result + lVar5) = __s2;
          if (n1 == 1) {
            result = (uchar **)((long)result + lVar5 + 8);
            local_38 = (uchar **)((long)local_38 + lVar5);
            goto LAB_001bf399;
          }
          __s2 = *(uchar **)((long)local_38 + lVar5 + 8);
          if (__s2 == (uchar *)0x0) goto LAB_001bf3da;
          iVar3 = strcmp((char *)__s2,(char *)__s1);
          cVar2 = (iVar3 != 0) * '\x05';
          if (iVar3 < 0) {
            cVar2 = '\x03';
          }
          lVar5 = lVar5 + 8;
          n1 = n1 - 1;
        } while (cVar2 == '\x03');
        result = (uchar **)((long)result + lVar5);
        if (cVar2 == '\0') break;
        local_38 = (uchar **)((long)local_38 + lVar5);
      }
      local_38 = (uchar **)((long)local_38 + lVar5);
    }
LAB_001bf32f:
    iVar3 = strcmp((char *)__s1,(char *)__s2);
    if (iVar3 != 0) {
      __assert_fail("cmp(key0, key1) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_unstable.cpp"
                    ,0x6c,
                    "void merge_2way_unstable(unsigned char **__restrict, size_t, unsigned char **__restrict, size_t, unsigned char **__restrict)"
                   );
    }
    *result = __s1;
    result[1] = __s2;
    result = result + 2;
    local_40 = local_40 + 1;
    local_38 = local_38 + 1;
    n1 = n1 - 1;
    n0 = n0 - 1;
    if (n0 == 0) {
LAB_001bf37a:
      if (n1 != 0) {
        memcpy(result,local_38,n1 * 8);
      }
      n0 = 0;
LAB_001bf3b5:
      bVar1 = false;
    }
    else {
      if (n1 == 0) {
LAB_001bf399:
        if (n0 != 0) {
          memcpy(result,local_40,n0 * 8);
        }
        n1 = 0;
        goto LAB_001bf3b5;
      }
      __s1 = *local_40;
      __s2 = *local_38;
      bVar1 = true;
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

static void
merge_2way_unstable(unsigned char** restrict from0, size_t n0,
                    unsigned char** restrict from1, size_t n1,
                    unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
initial:
	const int cmp01 = cmp(key0, key1);
	if (cmp01 > 0)  goto state_1lt0;
	if (cmp01 == 0) goto state_0eq1;
	// Fall through.
state_0lt1:
{
	debug() << "\tstate_0lt1\n";
	assert(cmp(key0, key1) <  0);
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp_0_1 = cmp(key0, key1);
	if (cmp_0_1 <  0) goto state_0lt1;
	if (cmp_0_1 == 0) goto state_0eq1;
	// Fall through.
}
state_1lt0:
{
	debug() << "\tstate_1lt0\n";
	assert(cmp(key1, key0) <  0);
	*result++ = key1;
	if (--n1 == 0) goto finish1;
	++from1;
	key1 = *from1;
	const int cmp_1_0 = cmp(key1, key0);
	if (cmp_1_0 < 0) goto state_1lt0;
	if (cmp_1_0 > 0) goto state_0lt1;
	// Fall through.
}
state_0eq1:
{
	debug() << "\tstate_0eq1\n";
	assert(cmp(key0, key1) == 0);
	*result++ = key0;
	*result++ = key1;
	++from0;
	++from1;
	--n0;
	--n1;
	if (n0 == 0) goto finish0;
	if (n1 == 0) goto finish1;
	key0 = *from0;
	key1 = *from1;
	goto initial;
}
finish0:
	assert(n0==0);
	if (n1) (void) memcpy(result, from1, n1*sizeof(unsigned char*));
	debug()<< "~" << __func__ << "\n";
	return;
finish1:
	assert(n1==0);
	if (n0) (void) memcpy(result, from0, n0*sizeof(unsigned char*));
	debug()<< "~" << __func__ << "\n";
	return;
}